

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O3

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uInt uVar6;
  uint uVar7;
  internal_state *piVar8;
  Bytef *pBVar9;
  Bytef *pBVar10;
  ulg uVar11;
  Posf *pPVar12;
  ulg uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  int iVar18;
  Bytef *pBVar19;
  long lVar20;
  byte *pbVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  Bytef *pBVar27;
  Bytef *pBVar28;
  ulong uVar29;
  byte *pbVar30;
  int local_48;
  
  piVar8 = strm->state;
  pbVar21 = strm->next_in;
  pbVar30 = pbVar21 + (strm->avail_in - 5);
  pBVar9 = strm->next_out;
  uVar6 = strm->avail_out;
  local_48 = (int)pBVar9 - (start - uVar6);
  iVar18 = *(int *)((long)&piVar8->gzhead + 4);
  uVar13 = piVar8->gzindex;
  uVar7 = *(uint *)((long)&piVar8->gzindex + 4);
  pBVar10 = *(Bytef **)&piVar8->method;
  uVar29._0_4_ = piVar8->w_size;
  uVar29._4_4_ = piVar8->w_bits;
  bVar2 = *(byte *)&piVar8->head;
  bVar3 = *(byte *)((long)&piVar8->head + 4);
  uVar14 = piVar8->w_mask;
  uVar11 = piVar8->window_size;
  pPVar12 = piVar8->prev;
  pBVar28 = pBVar9;
LAB_0010b15f:
  if (uVar14 < 0xf) {
    bVar4 = *pbVar21;
    pbVar1 = pbVar21 + 1;
    pbVar21 = pbVar21 + 2;
    uVar29 = ((ulong)*pbVar1 << ((byte)uVar14 + 8 & 0x3f)) +
             ((ulong)bVar4 << ((byte)uVar14 & 0x3f)) + uVar29;
    uVar14 = uVar14 | 0x10;
  }
  uVar25 = (ulong)((uint)uVar29 & ~(-1 << (bVar2 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)(uVar11 + 1 + uVar25 * 4);
    uVar29 = uVar29 >> (bVar4 & 0x3f);
    bVar5 = *(byte *)(uVar11 + uVar25 * 4);
    uVar22 = *(ushort *)(uVar11 + 2 + uVar25 * 4);
    uVar14 = uVar14 - bVar4;
    if (bVar5 == 0) break;
    pBVar27 = pBVar28;
    if ((bVar5 & 0x10) != 0) {
      uVar15 = (uint)uVar22;
      uVar17 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar14 < uVar17) {
          bVar4 = *pbVar21;
          pbVar21 = pbVar21 + 1;
          uVar29 = uVar29 + ((ulong)bVar4 << ((byte)uVar14 & 0x3f));
          uVar14 = uVar14 + 8;
        }
        uVar15 = (uint)uVar22 + (~(-1 << (sbyte)uVar17) & (uint)uVar29);
        uVar29 = uVar29 >> (sbyte)uVar17;
        uVar14 = uVar14 - uVar17;
      }
      if (uVar14 < 0xf) {
        bVar4 = *pbVar21;
        pbVar1 = pbVar21 + 1;
        pbVar21 = pbVar21 + 2;
        uVar29 = ((ulong)*pbVar1 << ((byte)uVar14 + 8 & 0x3f)) +
                 ((ulong)bVar4 << ((byte)uVar14 & 0x3f)) + uVar29;
        uVar14 = uVar14 | 0x10;
      }
      uVar25 = (ulong)((uint)uVar29 & ~(-1 << (bVar3 & 0x1f)));
      bVar5 = (byte)pPVar12[uVar25 * 2];
      bVar4 = *(byte *)((long)pPVar12 + uVar25 * 4 + 1);
      uVar22 = pPVar12[uVar25 * 2 + 1];
      uVar29 = uVar29 >> (bVar4 & 0x3f);
      uVar14 = uVar14 - bVar4;
      goto LAB_0010b27e;
    }
    if ((bVar5 & 0x40) != 0) {
      iVar18 = 0x3f3f;
      if ((bVar5 & 0x20) != 0) goto LAB_0010b574;
      pcVar16 = "invalid literal/length code";
      goto LAB_0010b56b;
    }
    uVar25 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar29) + (ulong)uVar22;
  }
  *pBVar28 = (Bytef)uVar22;
  goto LAB_0010b1cc;
LAB_0010b27e:
  if ((bVar5 & 0x10) != 0) goto LAB_0010b2bb;
  if ((bVar5 & 0x40) != 0) {
    pcVar16 = "invalid distance code";
    goto LAB_0010b56b;
  }
  lVar26 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar29) + (ulong)uVar22;
  bVar4 = *(byte *)((long)pPVar12 + lVar26 * 4 + 1);
  uVar29 = uVar29 >> (bVar4 & 0x3f);
  bVar5 = (byte)pPVar12[lVar26 * 2];
  uVar22 = pPVar12[lVar26 * 2 + 1];
  uVar14 = uVar14 - bVar4;
  goto LAB_0010b27e;
LAB_0010b2bb:
  uVar17 = bVar5 & 0xf;
  if (uVar14 < uVar17) {
    uVar29 = ((ulong)*pbVar21 << ((byte)uVar14 & 0x3f)) + uVar29;
    uVar23 = uVar14 + 8;
    if (uVar23 < uVar17) {
      pbVar1 = pbVar21 + 1;
      pbVar21 = pbVar21 + 2;
      uVar29 = uVar29 + ((ulong)*pbVar1 << ((byte)uVar23 & 0x3f));
      uVar14 = uVar14 + 0x10;
    }
    else {
      pbVar21 = pbVar21 + 1;
      uVar14 = uVar23;
    }
  }
  uVar24 = (~(-1 << (sbyte)uVar17) & (uint)uVar29) + (uint)uVar22;
  uVar29 = uVar29 >> (sbyte)uVar17;
  uVar14 = uVar14 - uVar17;
  uVar17 = (int)pBVar28 - local_48;
  uVar23 = uVar24 - uVar17;
  if (uVar24 < uVar17 || uVar23 == 0) {
    uVar25 = (ulong)uVar24;
    lVar26 = 0;
    uVar17 = uVar15;
    do {
      lVar20 = lVar26;
      pBVar28[lVar20] = pBVar28[lVar20 - uVar25];
      pBVar28[lVar20 + 1] = pBVar28[lVar20 + (1 - uVar25)];
      pBVar28[lVar20 + 2] = pBVar28[lVar20 + (2 - uVar25)];
      uVar17 = uVar17 - 3;
      lVar26 = lVar20 + 3;
    } while (2 < uVar17);
    if ((uint)lVar26 == uVar15) {
      pBVar27 = pBVar28 + lVar26;
    }
    else {
      pBVar28[lVar26] = pBVar28[lVar26 + -uVar25];
      if ((uint)lVar26 - uVar15 == -2) {
        pBVar27 = pBVar28 + lVar20 + 5;
        pBVar28[lVar20 + 4] = pBVar28[-uVar25 + 1 + lVar26];
      }
      else {
        pBVar27 = pBVar28 + lVar20 + 4;
      }
    }
    goto LAB_0010b1cf;
  }
  if (((uint)uVar13 < uVar23) && (piVar8[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
    pcVar16 = "invalid distance too far back";
LAB_0010b56b:
    strm->msg = pcVar16;
    iVar18 = 0x3f51;
LAB_0010b574:
    piVar8->status = iVar18;
LAB_0010b578:
    strm->next_in = pbVar21 + -(ulong)(uVar14 >> 3);
    strm->next_out = pBVar27;
    strm->avail_in = ((int)pbVar30 - (int)(pbVar21 + -(ulong)(uVar14 >> 3))) + 5;
    uVar29 = (ulong)((uint)uVar29 & ~(-1 << (sbyte)(uVar14 & 7)));
    strm->avail_out = ((int)(pBVar9 + (uVar6 - 0x101)) - (int)pBVar27) + 0x101;
    piVar8->w_size = (int)uVar29;
    piVar8->w_bits = (int)(uVar29 >> 0x20);
    piVar8->w_mask = uVar14 & 7;
    return;
  }
  if (uVar7 == 0) {
    pBVar19 = pBVar10 + (iVar18 - uVar23);
    uVar17 = uVar15 - uVar23;
    if (uVar23 <= uVar15 && uVar17 != 0) {
      lVar26 = 0;
      do {
        *pBVar28 = pBVar19[lVar26];
        pBVar28 = pBVar28 + 1;
        lVar26 = lVar26 + 1;
      } while (uVar23 != (uint)lVar26);
LAB_0010b4a3:
      pBVar19 = pBVar28 + -(ulong)uVar24;
      pBVar27 = pBVar28;
      uVar15 = uVar17;
    }
  }
  else if (uVar7 < uVar23) {
    pBVar19 = pBVar10 + ((iVar18 + uVar7) - uVar23);
    uVar23 = uVar23 - uVar7;
    uVar17 = uVar15 - uVar23;
    if (uVar23 <= uVar15 && uVar17 != 0) {
      lVar26 = 0;
      do {
        pBVar28[lVar26] = pBVar19[lVar26];
        lVar26 = lVar26 + 1;
      } while (uVar23 != (uint)lVar26);
      pBVar27 = pBVar28 + lVar26;
      pBVar19 = pBVar10;
      uVar15 = uVar17;
      if (uVar7 < uVar17) {
        lVar26 = 0;
        do {
          *pBVar27 = pBVar10[lVar26];
          pBVar27 = pBVar27 + 1;
          lVar26 = lVar26 + 1;
        } while (uVar7 != (uint)lVar26);
        pBVar19 = pBVar27 + -(ulong)uVar24;
        uVar15 = uVar17 - uVar7;
      }
    }
  }
  else {
    pBVar19 = pBVar10 + (uVar7 - uVar23);
    uVar17 = uVar15 - uVar23;
    if (uVar23 <= uVar15 && uVar17 != 0) {
      lVar26 = 0;
      do {
        *pBVar28 = pBVar19[lVar26];
        pBVar28 = pBVar28 + 1;
        lVar26 = lVar26 + 1;
      } while (uVar23 != (uint)lVar26);
      goto LAB_0010b4a3;
    }
  }
  for (; 2 < uVar15; uVar15 = uVar15 - 3) {
    *pBVar27 = *pBVar19;
    pBVar27[1] = pBVar19[1];
    pBVar27[2] = pBVar19[2];
    pBVar19 = pBVar19 + 3;
    pBVar27 = pBVar27 + 3;
  }
  if (uVar15 != 0) {
    *pBVar27 = *pBVar19;
    pBVar28 = pBVar27;
    if (uVar15 == 2) {
      pBVar27[1] = pBVar19[1];
      pBVar27 = pBVar27 + 2;
    }
    else {
LAB_0010b1cc:
      pBVar27 = pBVar28 + 1;
    }
  }
LAB_0010b1cf:
  if ((pbVar30 <= pbVar21) || (pBVar28 = pBVar27, pBVar9 + (uVar6 - 0x101) <= pBVar27))
  goto LAB_0010b578;
  goto LAB_0010b15f;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code here;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode[hold & lmask];
      dolen:
        op = (unsigned)(here.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here.val));
            *out++ = (unsigned char)(here.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode[hold & dmask];
          dodist:
            op = (unsigned)(here.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode[here.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode[here.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}